

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O1

outgoing_edges_range_t * __thiscall
tchecker::syncprod::syncprod_t::outgoing_edges
          (outgoing_edges_range_t *__return_storage_ptr__,syncprod_t *this,const_state_sptr_t *s)

{
  system_t *system;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
  local_20;
  
  if (s->_t != (make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL> *)0x0) {
    system = (this->_system).
             super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_20._t = (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
    reset(&local_20,(s->_t->super_state_t)._vloc._t);
    syncprod::outgoing_edges(__return_storage_ptr__,system,&local_20);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t(&local_20);
    return __return_storage_ptr__;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::syncprod::state_t>>::operator->() const [T = const tchecker::make_shared_t<tchecker::syncprod::state_t>]"
               );
}

Assistant:

void syncprod_t::initial(std::vector<sst_t> & v, tchecker::state_status_t mask) { tchecker::ts::initial(*this, v, mask); }